

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O3

FT_Error cff_slot_init(FT_GlyphSlot_conflict slot)

{
  long lVar1;
  FT_Module pFVar2;
  void *pvVar3;
  
  lVar1 = *(long *)(slot->face[4].bbox.yMin + 0x1358);
  if (lVar1 != 0) {
    pFVar2 = FT_Get_Module((slot->face->driver->root).library,"pshinter");
    if (pFVar2 != (FT_Module)0x0) {
      pvVar3 = (void *)(**(code **)(lVar1 + 0x10))(pFVar2);
      slot->internal->glyph_hints = pvVar3;
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_slot_init( FT_GlyphSlot  slot )
  {
    CFF_Face          face     = (CFF_Face)slot->face;
    CFF_Font          font     = (CFF_Font)face->extra.data;
    PSHinter_Service  pshinter = font->pshinter;


    if ( pshinter )
    {
      FT_Module  module;


      module = FT_Get_Module( slot->face->driver->root.library,
                              "pshinter" );
      if ( module )
      {
        T2_Hints_Funcs  funcs;


        funcs = pshinter->get_t2_funcs( module );
        slot->internal->glyph_hints = (void*)funcs;
      }
    }

    return FT_Err_Ok;
  }